

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.h
# Opt level: O2

int UTF_uj16_cmp(UTF_UC16 *uj16a,UTF_UC16 *uj16b)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  long lVar4;
  
  lVar4 = 0;
  uVar3 = 0xffffffff;
  while( true ) {
    uVar1 = *(ushort *)((long)uj16a + lVar4);
    uVar2 = *(ushort *)((long)uj16b + lVar4);
    if ((uVar1 == 0) || (uVar2 == 0)) {
      if (uVar2 <= uVar1) {
        uVar3 = (uint)(uVar2 < uVar1);
      }
      return uVar3;
    }
    if (uVar1 < uVar2) {
      return -1;
    }
    if (uVar1 >= uVar2 && uVar1 != uVar2) break;
    lVar4 = lVar4 + 2;
  }
  return 1;
}

Assistant:

static __inline int
UTF_uj16_cmp(const UTF_UC16 *uj16a, const UTF_UC16 *uj16b)
{
    while (*uj16a && *uj16b)
    {
        if (*uj16a < *uj16b) return -1;
        if (*uj16a > *uj16b) return 1;
        ++uj16a;
        ++uj16b;
    }
    if (*uj16a < *uj16b) return -1;
    if (*uj16a > *uj16b) return 1;
    return 0;
}